

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.hpp
# Opt level: O2

void __thiscall Args::Help::process(Help *this,Context *context)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  HelpPrinterIface *pHVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  ArgIface *pAVar6;
  HelpHasBeenPrintedException *this_00;
  ArgIface *this_01;
  String arg;
  string local_50 [32];
  ArgIface *pAVar5;
  
  pbVar1 = (context->m_it)._M_current;
  if (pbVar1 == (context->m_context).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    pHVar2 = (this->m_printer)._M_t.
             super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>
             .super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl;
    (*pHVar2->_vptr_HelpPrinterIface[2])(pHVar2,g_argsOutStream);
    goto LAB_00103b9a;
  }
  (context->m_it)._M_current = pbVar1 + 1;
  std::__cxx11::string::string((string *)&arg,(string *)pbVar1);
  bVar3 = details::isArgument(&arg);
  if (bVar3) {
LAB_00103b21:
    pHVar2 = (this->m_printer)._M_t.
             super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>
             .super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl;
    (*pHVar2->_vptr_HelpPrinterIface[3])(pHVar2,&arg,g_argsOutStream,0);
  }
  else {
    bVar3 = details::isFlag(&arg);
    if (bVar3) goto LAB_00103b21;
    pHVar2 = (this->m_printer)._M_t.
             super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>
             .super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl;
    iVar4 = (*pHVar2->_vptr_HelpPrinterIface[8])(pHVar2,&arg);
    pAVar5 = (ArgIface *)CONCAT44(extraout_var,iVar4);
    if (pAVar5 == (ArgIface *)0x0) {
LAB_00103b7c:
      pHVar2 = (this->m_printer)._M_t.
               super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>
               .super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl;
      (*pHVar2->_vptr_HelpPrinterIface[2])(pHVar2,g_argsOutStream);
    }
    else {
      iVar4 = (*pAVar5->_vptr_ArgIface[2])(pAVar5);
      if (iVar4 != 0) goto LAB_00103b7c;
      this_01 = pAVar5;
      while (pbVar1 = (context->m_it)._M_current,
            pbVar1 != (context->m_context).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
        (context->m_it)._M_current = pbVar1 + 1;
        std::__cxx11::string::_M_assign((string *)&arg);
        if (this_01 == (ArgIface *)0x0) goto LAB_00103c88;
        iVar4 = (*this_01->_vptr_ArgIface[2])(this_01);
        if (iVar4 != 0) goto LAB_00103c46;
        bVar3 = details::isArgument(&arg);
        if (bVar3) {
LAB_00103c20:
          pHVar2 = (this->m_printer)._M_t.
                   super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>
                   .super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl;
          (*pHVar2->_vptr_HelpPrinterIface[3])(pHVar2,&arg,g_argsOutStream,this_01);
          goto LAB_00103b90;
        }
        bVar3 = details::isFlag(&arg);
        if (bVar3) goto LAB_00103c20;
        pAVar6 = Command::findChild((Command *)this_01,&arg);
        pAVar5 = this_01;
        this_01 = pAVar6;
      }
      if (this_01 == (ArgIface *)0x0) {
LAB_00103c88:
        pHVar2 = (this->m_printer)._M_t.
                 super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>
                 .super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl;
        (*pHVar2->_vptr_HelpPrinterIface[2])(pHVar2,g_argsOutStream);
      }
      else {
LAB_00103c46:
        pHVar2 = (this->m_printer)._M_t.
                 super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>
                 .super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl;
        (*this_01->_vptr_ArgIface[3])(local_50,this_01);
        pAVar6 = (ArgIface *)0x0;
        if (pAVar5 != this_01) {
          pAVar6 = pAVar5;
        }
        (*pHVar2->_vptr_HelpPrinterIface[3])(pHVar2,local_50,g_argsOutStream,pAVar6);
        std::__cxx11::string::~string(local_50);
      }
    }
  }
LAB_00103b90:
  std::__cxx11::string::~string((string *)&arg);
LAB_00103b9a:
  (this->super_Arg).m_isDefined = true;
  if (this->m_throwExceptionOnPrint != true) {
    return;
  }
  this_00 = (HelpHasBeenPrintedException *)__cxa_allocate_exception(0x30);
  HelpHasBeenPrintedException::HelpHasBeenPrintedException(this_00);
  __cxa_throw(this_00,&HelpHasBeenPrintedException::typeinfo,BaseException::~BaseException);
}

Assistant:

inline void
Help::process( Context & context )
{
	if( !context.atEnd() )
	{
		String arg = *context.next();

		// Argument or flag.
		if( details::isArgument( arg ) || details::isFlag( arg ) )
			m_printer->print( arg, g_argsOutStream );
		// Command?
		else
		{
			auto * tmp = m_printer->findArgument( arg );

			// Command.
			if( tmp && tmp->type() == ArgType::Command )
			{
				bool printed = false;

				auto * cmd = static_cast< Command* > ( tmp );

				while( !context.atEnd() )
				{
					arg = *context.next();

					if( tmp && tmp->type() == ArgType::Command )
					{
						cmd = static_cast< Command* > ( tmp );

						// Argument or flag.
						if( details::isArgument( arg ) || details::isFlag( arg ) )
						{
							m_printer->print( arg, g_argsOutStream, cmd );

							printed = true;

							break;
						}
						// Command?
						else
							tmp = cmd->findChild( arg );
					}
					else
						break;
				}

				if( !printed )
				{
					if( tmp )
						m_printer->print( tmp->name(), g_argsOutStream,
							( cmd != tmp ? cmd : nullptr ) );
					else
						m_printer->print( g_argsOutStream );
				}
			}
			else
				m_printer->print( g_argsOutStream );
		}
	}
	else
		m_printer->print( g_argsOutStream );

	setDefined( true );

	if( m_throwExceptionOnPrint )
		throw HelpHasBeenPrintedException();
}